

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O3

void adiak_fini(void)

{
  int iVar1;
  adiak_value_t val;
  timeval etime;
  adiak_value_t local_30;
  long local_28;
  long local_20;
  long local_18;
  timeval local_10;
  
  if (measure_adiak_cputime == '\x01') {
    iVar1 = adksys_get_times((timeval *)0x0,(timeval *)&local_30);
    if (iVar1 != -1) {
      adiak_namevalue("cputime",3,"timing","%t",&local_30);
    }
  }
  if (measure_adiak_systime == '\x01') {
    iVar1 = adksys_get_times((timeval *)&local_30,(timeval *)0x0);
    if (iVar1 != -1) {
      adiak_namevalue("systime",3,"timing","%t",&local_30);
    }
  }
  if (measure_adiak_walltime == '\x01') {
    iVar1 = adksys_starttime((timeval *)&local_30);
    if (iVar1 != -1) {
      iVar1 = adksys_curtime(&local_10);
      if (iVar1 != -1) {
        local_20 = local_10.tv_sec - CONCAT44(local_30.v_long._4_4_,local_30.v_int);
        if (local_10.tv_usec < local_28) {
          local_10.tv_usec = local_10.tv_usec + 1000000;
          local_20 = local_20 + -1;
        }
        local_18 = local_10.tv_usec - local_28;
        adiak_namevalue("walltime",3,"timing","%t");
      }
    }
  }
  local_30.v_int = 0;
  adiak_raw_namevalue("fini",4,(char *)0x0,&local_30,&base_int);
  return;
}

Assistant:

void adiak_fini()
{
   adiak_value_t val;
   if (measure_adiak_cputime)
      measure_cputime();
   if (measure_adiak_systime)
      measure_systime();
   if (measure_adiak_walltime)
      measure_walltime();

   val.v_int = 0;
   adiak_raw_namevalue("fini", adiak_control, NULL, &val, &base_int);
}